

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

Features Json::Features::strictMode(void)

{
  Features FVar1;
  
  FVar1.allowComments_ = false;
  FVar1.strictRoot_ = true;
  FVar1.allowDroppedNullPlaceholders_ = false;
  FVar1.allowNumericKeys_ = false;
  return FVar1;
}

Assistant:

Features Features::strictMode() {
  Features features;
  features.allowComments_ = false;
  features.strictRoot_ = true;
  features.allowDroppedNullPlaceholders_ = false;
  features.allowNumericKeys_ = false;
  return features;
}